

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

void __thiscall rcg::Buffer::setHandle(Buffer *this,void *handle)

{
  shared_ptr<const_rcg::GenTLWrapper> *gentl;
  element_type *peVar1;
  code *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  void *pvVar3;
  unsigned_long uVar4;
  void *stream;
  
  this->buffer = handle;
  this->payload_type = 0;
  this->multipart = false;
  if (handle == (void *)0x0) {
    if ((this->chunkadapter).
        super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      GenApi_3_4::CChunkAdapter::DetachBuffer();
      return;
    }
  }
  else {
    gentl = &this->gentl;
    pvVar3 = Stream::getHandle(this->parent);
    uVar4 = anon_unknown_6::getBufferValue<unsigned_long>(gentl,pvVar3,this->buffer,0x13);
    this->payload_type = uVar4;
    pvVar3 = Stream::getHandle(this->parent);
    uVar4 = anon_unknown_6::getBufferValue<unsigned_long>(gentl,pvVar3,this->buffer,0x13);
    this->multipart = uVar4 == 10;
    if ((this->chunkadapter).
        super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pvVar3 = Stream::getHandle(this->parent);
      bVar2 = anon_unknown_6::getBufferBool(gentl,pvVar3,this->buffer,7);
      if (!bVar2) {
        peVar1 = (this->chunkadapter).
                 super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pvVar3 = Stream::getHandle(this->parent);
        pvVar3 = (anonymous_namespace)::getBufferValue<void*>(gentl,pvVar3,this->buffer,0);
        stream = Stream::getHandle(this->parent);
        uVar4 = anon_unknown_6::getBufferValue<unsigned_long>(gentl,stream,this->buffer,9);
        UNRECOVERED_JUMPTABLE = *(code **)(*(long *)peVar1 + 0x18);
        (*UNRECOVERED_JUMPTABLE)(peVar1,pvVar3,uVar4,0,UNRECOVERED_JUMPTABLE);
        return;
      }
    }
  }
  return;
}

Assistant:

void Buffer::setHandle(void *handle)
{
  buffer=handle;

  payload_type=PAYLOAD_TYPE_UNKNOWN;
  multipart=false;

  if (buffer != 0)
  {
    payload_type=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                        GenTL::BUFFER_INFO_PAYLOADTYPE);

    multipart=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                     GenTL::BUFFER_INFO_PAYLOADTYPE) == PAYLOAD_TYPE_MULTI_PART;

    if (chunkadapter && !getBufferBool(gentl, parent->getHandle(), buffer,
      GenTL::BUFFER_INFO_IS_INCOMPLETE))
    {
      chunkadapter->AttachBuffer(reinterpret_cast<uint8_t *>(
        getBufferValue<void *>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_BASE)),
        static_cast<int64_t>(getBufferValue<size_t>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_SIZE_FILLED)));
    }
  }
  else
  {
    if (chunkadapter)
    {
      chunkadapter->DetachBuffer();
    }
  }
}